

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt)

{
  uint uVar1;
  void *value5;
  uint uVar2;
  byte *pbVar3;
  xmlChar *pxVar4;
  xmlXPathObjectPtr pxVar5;
  xmlChar *pxVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  byte *pbVar11;
  int iVar12;
  long lVar13;
  xmlChar xVar14;
  byte *pbVar15;
  bool bVar16;
  double dVar17;
  undefined8 local_48;
  double local_40;
  double local_38;
  
  pbVar11 = ctxt->cur;
  pbVar3 = pbVar11;
  while( true ) {
    pbVar15 = pbVar3 + 1;
    bVar9 = *pbVar3;
    uVar7 = (ulong)bVar9;
    if (0x28 < uVar7) break;
    if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
      if ((0x11000000000U >> (uVar7 & 0x3f) & 1) != 0) goto switchD_001df580_caseD_27;
      break;
    }
    ctxt->cur = pbVar15;
    pbVar11 = (byte *)(ulong)((int)pbVar11 + 1);
    pbVar3 = pbVar15;
  }
  if ((byte)(bVar9 - 0x30) < 10) goto switchD_001df580_caseD_27;
  switch(bVar9) {
  case 0x27:
    break;
  case 0x28:
  case 0x29:
  case 0x2b:
  case 0x2c:
  case 0x2d:
switchD_001df580_caseD_28:
    while (((byte)uVar7 < 0x21 && ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0))) {
      ctxt->cur = pbVar15;
      bVar9 = *pbVar15;
      pbVar11 = (byte *)(ulong)((int)pbVar11 + 1);
      pbVar15 = pbVar15 + 1;
      uVar7 = (ulong)bVar9;
    }
    uVar2 = xmlXPathCurrentChar(ctxt,(int *)&local_48);
    if ((uVar2 < 0x3f) && ((0x4000800100000000U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
LAB_001df9de:
      xmlXPathErr(ctxt,7);
      return;
    }
    if (uVar2 < 0x100) {
      if ((0x16 < uVar2 - 0xc0 && 0x19 < (uVar2 & 0xdf) - 0x41) &&
         (((uVar2 < 0xf8 && 0x1e < uVar2 - 0xd8 && ((char)uVar2 != '_')) && ((uVar2 & 0xff) != 0x3a)
          ))) goto LAB_001df9de;
    }
    else {
      iVar10 = xmlCharInRange(uVar2,&xmlIsBaseCharGroup);
      if ((iVar10 == 0) && ((8 < uVar2 - 0x3021 && 0x51a5 < uVar2 - 0x4e00) && uVar2 != 0x3007))
      goto LAB_001df9de;
    }
    while ((0x3e < uVar2 || ((0x4000800100000000U >> ((ulong)uVar2 & 0x3f) & 1) == 0))) {
      if (uVar2 < 0x100) {
        if ((0x16 < uVar2 - 0xc0 && 0x19 < (uVar2 & 0xdf) - 0x41) &&
           ((9 < uVar2 - 0x30 && 0x1e < uVar2 - 0xd8) && uVar2 < 0xf8)) {
LAB_001dfe79:
          if ((0x32 < uVar2 - 0x2d) ||
             ((0x4000000002003U >> ((ulong)(uVar2 - 0x2d) & 0x3f) & 1) == 0)) {
            if (uVar2 < 0x100) {
              uVar2 = (uint)(uVar2 == 0xb7);
            }
            else {
              iVar10 = xmlCharInRange(uVar2,&xmlIsCombiningGroup);
              if (iVar10 != 0) goto LAB_001dfe92;
              uVar2 = xmlCharInRange(uVar2,&xmlIsExtenderGroup);
            }
            if (uVar2 == 0) break;
          }
        }
      }
      else {
        iVar10 = xmlCharInRange(uVar2,&xmlIsBaseCharGroup);
        if (((iVar10 == 0) && ((8 < uVar2 - 0x3021 && 0x51a5 < uVar2 - 0x4e00) && uVar2 != 0x3007))
           && (iVar10 = xmlCharInRange(uVar2,&xmlIsDigitGroup), iVar10 == 0)) goto LAB_001dfe79;
      }
LAB_001dfe92:
      ctxt->cur = ctxt->cur + (int)local_48;
      uVar2 = xmlXPathCurrentChar(ctxt,(int *)&local_48);
    }
    pxVar4 = xmlStrndup(pbVar15 + -1,*(int *)&ctxt->cur - (int)pbVar11);
    ctxt->cur = pbVar15 + -1;
    if (pxVar4 == (xmlChar *)0x0) goto LAB_001df9de;
    pxVar6 = xmlStrstr(pxVar4,(xmlChar *)"::");
    if (pxVar6 == (xmlChar *)0x0) {
      iVar10 = xmlStrlen(pxVar4);
      lVar13 = (long)iVar10;
      do {
        xVar14 = ctxt->cur[lVar13];
        if (xVar14 != ' ') {
          bVar16 = false;
          if ((xVar14 == '\0') || (bVar16 = false, xVar14 == '/')) goto LAB_001e008d;
          if ((1 < (byte)(xVar14 - 9)) && (xVar14 != '\r')) goto LAB_001e0015;
        }
        lVar13 = lVar13 + 1;
      } while( true );
    }
    (*xmlFree)(pxVar4);
    pbVar3 = ctxt->cur;
    goto LAB_001df591;
  case 0x2a:
  case 0x2f:
switchD_001df580_caseD_2a:
    xmlXPathCompExprAdd(ctxt,-1,-1,bVar9 == 0x2f ^ XPATH_OP_NODE,0,0,0,(void *)0x0,(void *)0x0);
    pbVar11 = ctxt->cur;
    while( true ) {
      uVar7 = (ulong)*pbVar11;
      if (0x2f < uVar7) break;
      if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
        if (uVar7 == 0x2f) goto LAB_001df6cd;
        break;
      }
      ctxt->cur = pbVar11 + 1;
      pbVar11 = pbVar11 + 1;
    }
    goto LAB_001df84a;
  case 0x2e:
    if (9 < (byte)(*pbVar15 - 0x30)) goto LAB_001df591;
    break;
  default:
    if (bVar9 == 0x40) goto switchD_001df580_caseD_2a;
    if (bVar9 != 0x22) goto switchD_001df580_caseD_28;
  }
switchD_001df580_caseD_27:
  pbVar3 = pbVar3 + 1;
  pbVar11 = pbVar3;
  while( true ) {
    bVar9 = pbVar11[-1];
    uVar7 = (ulong)bVar9;
    if (0x28 < uVar7) break;
    if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
      if (uVar7 == 0x24) {
        ctxt->cur = pbVar11;
        pxVar4 = xmlXPathParseQName(ctxt,(xmlChar **)&local_48);
        if (pxVar4 != (xmlChar *)0x0) {
          ctxt->comp->last = -1;
          iVar10 = xmlXPathCompExprAdd(ctxt,-1,-1,XPATH_OP_VARIABLE,0,0,0,pxVar4,
                                       (void *)CONCAT44(local_48._4_4_,(int)local_48));
          if (iVar10 == -1) {
            (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
            (*xmlFree)(pxVar4);
          }
          pbVar11 = ctxt->cur;
          while( true ) {
            if ((0x20 < (ulong)*pbVar11) || ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0))
            break;
            ctxt->cur = pbVar11 + 1;
            pbVar11 = pbVar11 + 1;
          }
          if ((ctxt->context != (xmlXPathContextPtr)0x0) &&
             (iVar10 = 0x18, (ctxt->context->flags & 2) != 0)) goto LAB_001df60d;
          goto LAB_001df612;
        }
        (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
        iVar10 = 4;
        goto LAB_001df60d;
      }
      if (uVar7 == 0x28) goto LAB_001df422;
      break;
    }
    ctxt->cur = pbVar11;
    pbVar11 = pbVar11 + 1;
    pbVar3 = pbVar3 + 1;
  }
  bVar8 = bVar9 - 0x30;
  if (bVar8 < 10) {
LAB_001df445:
    if (ctxt->error == 0) {
      if (bVar9 != 0x2e && bVar9 < 0x30) goto LAB_001df465;
      if (bVar8 < 10) {
        dVar17 = 0.0;
        do {
          ctxt->cur = pbVar11;
          dVar17 = (double)((uint)uVar7 & 0xffffff0f) + dVar17 * 10.0;
          bVar9 = *pbVar11;
          uVar7 = (ulong)bVar9;
          pbVar11 = pbVar11 + 1;
        } while ((byte)(bVar9 - 0x30) < 10);
      }
      else {
        dVar17 = 0.0;
      }
      pbVar3 = pbVar11 + -1;
      if (bVar9 == 0x2e) {
        ctxt->cur = pbVar11;
        bVar9 = *pbVar11;
        if (bVar9 < 0x30) {
          if (bVar8 < 10) {
LAB_001dfbc0:
            uVar2 = 0;
LAB_001dfbc2:
            local_38 = 0.0;
            if ((byte)(bVar9 - 0x30) < 10) {
              uVar1 = uVar2 + 0x14;
              do {
                pbVar11 = pbVar11 + 1;
                local_38 = local_38 * 10.0 + (double)(int)(bVar9 - 0x30);
                uVar2 = uVar2 + 1;
                ctxt->cur = pbVar11;
                bVar9 = *pbVar11;
                if (9 < (byte)(bVar9 - 0x30)) break;
              } while (uVar2 < uVar1);
            }
            local_40 = dVar17;
            dVar17 = pow(10.0,(double)(int)uVar2);
            dVar17 = local_40 + local_38 / dVar17;
            pbVar3 = ctxt->cur;
            bVar9 = *pbVar3;
            while ((byte)(bVar9 - 0x30) < 10) {
              pbVar3 = pbVar3 + 1;
              ctxt->cur = pbVar3;
              bVar9 = *pbVar3;
            }
            goto LAB_001dfc5f;
          }
        }
        else if ((bVar8 < 10) || (bVar9 < 0x3a)) {
          if (bVar9 != 0x30) goto LAB_001dfbc0;
          uVar2 = 0;
          do {
            pbVar11 = pbVar11 + 1;
            uVar2 = uVar2 + 1;
            ctxt->cur = pbVar11;
            bVar9 = *pbVar11;
          } while (bVar9 == 0x30);
          goto LAB_001dfbc2;
        }
LAB_001df465:
        iVar10 = 1;
        goto LAB_001df60d;
      }
LAB_001dfc5f:
      if ((bVar9 | 0x20) == 0x65) {
        pbVar11 = pbVar3 + 1;
        ctxt->cur = pbVar11;
        bVar9 = pbVar3[1];
        if ((bVar9 == 0x2d) || (bVar8 = bVar9, bVar9 == 0x2b)) {
          pbVar11 = pbVar3 + 2;
          ctxt->cur = pbVar11;
          bVar8 = pbVar3[2];
        }
        iVar10 = 0;
        if ((byte)(bVar8 - 0x30) < 10) {
          iVar10 = 0;
          do {
            pbVar11 = pbVar11 + 1;
            iVar12 = (bVar8 - 0x30) + iVar10 * 10;
            if (999999 < iVar10) {
              iVar12 = iVar10;
            }
            iVar10 = iVar12;
            ctxt->cur = pbVar11;
            bVar8 = *pbVar11;
          } while ((byte)(bVar8 - 0x30) < 10);
        }
        iVar12 = -iVar10;
        if (bVar9 != 0x2d) {
          iVar12 = iVar10;
        }
        local_40 = dVar17;
        dVar17 = pow(10.0,(double)iVar12);
        dVar17 = local_40 * dVar17;
      }
      pxVar5 = xmlXPathCacheNewFloat(ctxt->context,dVar17);
      if (pxVar5 == (xmlXPathObjectPtr)0x0) {
        ctxt->error = 0xf;
      }
      else {
        iVar10 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_VALUE,3,0,0,pxVar5,
                                     (void *)0x0);
        if (iVar10 == -1) {
          xmlXPathReleaseObject(ctxt->context,pxVar5);
        }
      }
    }
  }
  else {
    pbVar15 = pbVar11;
    if (bVar9 == 0x22) {
      while( true ) {
        ctxt->cur = pbVar15;
        do {
          uVar2 = (uint)*pbVar15;
          if (*pbVar15 < 0x20) {
            if ((0xd < uVar2) || ((0x2600U >> (uVar2 & 0x1f) & 1) == 0)) goto LAB_001e0008;
            goto LAB_001df8da;
          }
        } while (uVar2 == 0);
        if (uVar2 == 0x22) break;
LAB_001df8da:
        pbVar15 = pbVar15 + 1;
      }
    }
    else {
      if (bVar9 != 0x27) {
        if ((bVar9 != 0x2e) || (9 < (byte)(*pbVar11 - 0x30))) {
          pxVar4 = xmlXPathParseQName(ctxt,(xmlChar **)&local_48);
          if (pxVar4 == (xmlChar *)0x0) {
            (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
          }
          else {
            pbVar11 = ctxt->cur;
            while( true ) {
              pbVar3 = pbVar11 + 1;
              uVar7 = (ulong)*pbVar11;
              if (0x28 < uVar7) break;
              if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
                if (uVar7 == 0x28) goto LAB_001dfa03;
                break;
              }
              ctxt->cur = pbVar3;
              pbVar11 = pbVar3;
            }
            (*xmlFree)(pxVar4);
            (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
          }
LAB_001dfac6:
          iVar10 = 7;
          goto LAB_001df60d;
        }
        goto LAB_001df445;
      }
      while( true ) {
        ctxt->cur = pbVar15;
        do {
          uVar2 = (uint)*pbVar15;
          if (*pbVar15 < 0x20) {
            if ((0xd < uVar2) || ((0x2600U >> (uVar2 & 0x1f) & 1) == 0)) goto LAB_001e0008;
            goto LAB_001df8a5;
          }
        } while (uVar2 == 0);
        if (uVar2 == 0x27) break;
LAB_001df8a5:
        pbVar15 = pbVar15 + 1;
      }
    }
    pxVar4 = xmlStrndup(pbVar11,(int)pbVar15 - (int)pbVar3);
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    if (pxVar4 != (xmlChar *)0x0) {
      pxVar5 = xmlXPathCacheNewString(ctxt->context,pxVar4);
      if (pxVar5 == (xmlXPathObjectPtr)0x0) {
        ctxt->error = 0xf;
      }
      else {
        iVar10 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_VALUE,4,0,0,pxVar5,
                                     (void *)0x0);
        if (iVar10 == -1) {
          xmlXPathReleaseObject(ctxt->context,pxVar5);
        }
      }
      (*xmlFree)(pxVar4);
    }
  }
  goto LAB_001df612;
LAB_001e0015:
  if (xVar14 == '(') {
    iVar10 = xmlXPathIsNodeType(pxVar4);
    bVar16 = iVar10 == 0;
    xVar14 = ctxt->cur[lVar13];
  }
  else {
    bVar16 = false;
  }
LAB_001e008d:
  (*xmlFree)(pxVar4);
  pbVar3 = ctxt->cur;
  if ((xVar14 == '\0') || (!bVar16)) {
LAB_001df591:
    bVar9 = *pbVar3;
    goto switchD_001df580_caseD_2a;
  }
  goto switchD_001df580_caseD_27;
LAB_001df6cd:
  do {
    pbVar11 = ctxt->cur;
    if (*pbVar11 != 0x2f) break;
    if (pbVar11[1] == 0x2f) {
      pbVar11 = pbVar11 + 2;
      while( true ) {
        ctxt->cur = pbVar11;
        if ((0x20 < (ulong)*pbVar11) || ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0))
        break;
        pbVar11 = pbVar11 + 1;
      }
      xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0);
LAB_001df764:
      xmlXPathCompRelativeLocationPath(ctxt);
    }
    else {
      do {
        pbVar11 = pbVar11 + 1;
        ctxt->cur = pbVar11;
        bVar9 = *pbVar11;
        uVar7 = (ulong)bVar9;
        if (0x20 < uVar7) goto LAB_001df714;
      } while ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0);
      if (uVar7 != 0) {
LAB_001df714:
        if (((byte)((bVar9 & 0xdf) + 0xbf) < 0x1a) ||
           ((bVar9 - 0x2a < 0x36 && ((0x20000000400011U >> ((ulong)(bVar9 - 0x2a) & 0x3f) & 1) != 0)
            ))) goto LAB_001df764;
      }
    }
  } while (ctxt->error == 0);
  goto LAB_001df852;
LAB_001df422:
  while( true ) {
    ctxt->cur = pbVar11;
    if ((0x20 < (ulong)*pbVar11) || ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0)) break;
    pbVar11 = pbVar11 + 1;
  }
  xmlXPathCompileExpr(ctxt,1);
  if (ctxt->error == 0) {
    pbVar11 = ctxt->cur;
    if (*pbVar11 == 0x29) {
      do {
        pbVar11 = pbVar11 + 1;
        ctxt->cur = pbVar11;
        if (0x20 < (ulong)*pbVar11) break;
      } while ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0);
      goto LAB_001df612;
    }
    xmlXPathErr(ctxt,7);
  }
  goto LAB_001df788;
LAB_001e0008:
  iVar10 = 2;
LAB_001df60d:
  xmlXPathErr(ctxt,iVar10);
  goto LAB_001df612;
LAB_001dfa03:
  while( true ) {
    ctxt->cur = pbVar3;
    if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
    pbVar3 = pbVar3 + 1;
  }
  value5 = (void *)CONCAT44(local_48._4_4_,(int)local_48);
  uVar2 = 1;
  if ((value5 == (void *)0x0) && (*pxVar4 == 'c')) {
    iVar10 = xmlStrEqual(pxVar4,(xmlChar *)"count");
    uVar2 = (uint)(iVar10 == 0);
    pbVar3 = ctxt->cur;
  }
  ctxt->comp->last = -1;
  iVar10 = -1;
  iVar12 = 0;
  if ((*pbVar3 == 0) || (iVar12 = 0, *pbVar3 == 0x29)) {
LAB_001e003e:
    iVar10 = xmlXPathCompExprAdd(ctxt,iVar10,-1,XPATH_OP_FUNCTION,iVar12,0,0,pxVar4,value5);
    if (iVar10 == -1) {
      (*xmlFree)(value5);
      (*xmlFree)(pxVar4);
    }
    pbVar11 = ctxt->cur;
    if (*pbVar11 != 0) goto LAB_001e00cd;
    while (((ulong)*pbVar11 < 0x21 && ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0))) {
LAB_001e00cd:
      pbVar11 = pbVar11 + 1;
      ctxt->cur = pbVar11;
    }
  }
  else {
    xmlXPathCompileExpr(ctxt,uVar2);
    if (ctxt->error == 0) {
      iVar12 = 0;
      iVar10 = -1;
      do {
        xmlXPathCompExprAdd(ctxt,iVar10,ctxt->comp->last,XPATH_OP_ARG,0,0,0,(void *)0x0,(void *)0x0)
        ;
        iVar12 = iVar12 + 1;
        pbVar11 = ctxt->cur;
        if (*pbVar11 != 0x2c) {
          if (*pbVar11 != 0x29) {
            (*xmlFree)(pxVar4);
            (*xmlFree)(value5);
            goto LAB_001dfac6;
          }
LAB_001e0037:
          iVar10 = ctxt->comp->last;
          goto LAB_001e003e;
        }
        do {
          pbVar11 = pbVar11 + 1;
          ctxt->cur = pbVar11;
          uVar7 = (ulong)*pbVar11;
          if (0x20 < uVar7) goto LAB_001dff94;
        } while ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0);
        if (uVar7 == 0) goto LAB_001e0037;
LAB_001dff94:
        local_40 = (double)CONCAT44(local_40._4_4_,ctxt->comp->last);
        ctxt->comp->last = -1;
        xmlXPathCompileExpr(ctxt,uVar2);
        iVar10 = local_40._0_4_;
      } while (ctxt->error == 0);
    }
    (*xmlFree)(pxVar4);
    (*xmlFree)(value5);
  }
LAB_001df612:
  pbVar11 = ctxt->cur;
  while( true ) {
    if ((0x20 < (ulong)*pbVar11) || ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar11 + 1;
    pbVar11 = pbVar11 + 1;
  }
LAB_001df788:
  if (ctxt->error == 0) {
    pbVar11 = ctxt->cur;
    while( true ) {
      bVar9 = *pbVar11;
      if ((0x20 < (ulong)bVar9) || ((0x100002600U >> ((ulong)bVar9 & 0x3f) & 1) == 0)) break;
      pbVar11 = pbVar11 + 1;
      ctxt->cur = pbVar11;
    }
    if (bVar9 == 0x5b) {
      do {
        xmlXPathCompPredicate(ctxt,1);
        pbVar11 = ctxt->cur;
        while( true ) {
          bVar9 = *pbVar11;
          if ((0x20 < (ulong)bVar9) || ((0x100002600U >> ((ulong)bVar9 & 0x3f) & 1) == 0)) break;
          pbVar11 = pbVar11 + 1;
          ctxt->cur = pbVar11;
        }
      } while (bVar9 == 0x5b);
      if (ctxt->error != 0) {
        return;
      }
    }
    if (bVar9 == 0x2f) {
      if (pbVar11[1] == 0x2f) {
        pbVar11 = pbVar11 + 2;
        while( true ) {
          ctxt->cur = pbVar11;
          if ((0x20 < (ulong)*pbVar11) || ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0))
          break;
          pbVar11 = pbVar11 + 1;
        }
        xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0)
        ;
      }
LAB_001df84a:
      xmlXPathCompRelativeLocationPath(ctxt);
    }
LAB_001df852:
    pbVar11 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar11) || ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar11 + 1;
      pbVar11 = pbVar11 + 1;
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt) {
    int lc = 1;           /* Should we branch to LocationPath ?         */
    xmlChar *name = NULL; /* we may have to preparse a name to find out */

    SKIP_BLANKS;
    if ((CUR == '$') || (CUR == '(') ||
	(IS_ASCII_DIGIT(CUR)) ||
        (CUR == '\'') || (CUR == '"') ||
	(CUR == '.' && IS_ASCII_DIGIT(NXT(1)))) {
	lc = 0;
    } else if (CUR == '*') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '/') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '@') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else if (CUR == '.') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else {
	/*
	 * Problem is finding if we have a name here whether it's:
	 *   - a nodetype
	 *   - a function call in which case it's followed by '('
	 *   - an axis in which case it's followed by ':'
	 *   - a element name
	 * We do an a priori analysis here rather than having to
	 * maintain parsed token content through the recursive function
	 * calls. This looks uglier but makes the code easier to
	 * read/write/debug.
	 */
	SKIP_BLANKS;
	name = xmlXPathScanName(ctxt);
	if ((name != NULL) && (xmlStrstr(name, (xmlChar *) "::") != NULL)) {
#ifdef DEBUG_STEP
	    xmlGenericError(xmlGenericErrorContext,
		    "PathExpr: Axis\n");
#endif
	    lc = 1;
	    xmlFree(name);
	} else if (name != NULL) {
	    int len =xmlStrlen(name);


	    while (NXT(len) != 0) {
		if (NXT(len) == '/') {
		    /* element name */
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if (IS_BLANK_CH(NXT(len))) {
		    /* ignore blanks */
		    ;
		} else if (NXT(len) == ':') {
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if ((NXT(len) == '(')) {
		    /* Node Type or Function */
		    if (xmlXPathIsNodeType(name)) {
#ifdef DEBUG_STEP
		        xmlGenericError(xmlGenericErrorContext,
				"PathExpr: Type search\n");
#endif
			lc = 1;
#ifdef LIBXML_XPTR_LOCS_ENABLED
                    } else if (ctxt->xptr &&
                               xmlStrEqual(name, BAD_CAST "range-to")) {
                        lc = 1;
#endif
		    } else {
#ifdef DEBUG_STEP
		        xmlGenericError(xmlGenericErrorContext,
				"PathExpr: function call\n");
#endif
			lc = 0;
		    }
                    break;
		} else if ((NXT(len) == '[')) {
		    /* element name */
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if ((NXT(len) == '<') || (NXT(len) == '>') ||
			   (NXT(len) == '=')) {
		    lc = 1;
		    break;
		} else {
		    lc = 1;
		    break;
		}
		len++;
	    }
	    if (NXT(len) == 0) {
#ifdef DEBUG_STEP
		xmlGenericError(xmlGenericErrorContext,
			"PathExpr: AbbrRelLocation\n");
#endif
		/* element name */
		lc = 1;
	    }
	    xmlFree(name);
	} else {
	    /* make sure all cases are covered explicitly */
	    XP_ERROR(XPATH_EXPR_ERROR);
	}
    }

    if (lc) {
	if (CUR == '/') {
	    PUSH_LEAVE_EXPR(XPATH_OP_ROOT, 0, 0);
	} else {
	    PUSH_LEAVE_EXPR(XPATH_OP_NODE, 0, 0);
	}
	xmlXPathCompLocationPath(ctxt);
    } else {
	xmlXPathCompFilterExpr(ctxt);
	CHECK_ERROR;
	if ((CUR == '/') && (NXT(1) == '/')) {
	    SKIP(2);
	    SKIP_BLANKS;

	    PUSH_LONG_EXPR(XPATH_OP_COLLECT, AXIS_DESCENDANT_OR_SELF,
		    NODE_TEST_TYPE, NODE_TYPE_NODE, NULL, NULL);

	    xmlXPathCompRelativeLocationPath(ctxt);
	} else if (CUR == '/') {
	    xmlXPathCompRelativeLocationPath(ctxt);
	}
    }
    SKIP_BLANKS;
}